

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void __thiscall picosha2::hash256_one_by_one::finish(hash256_one_by_one *this)

{
  int local_84 [3];
  uchar *local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  size_type local_68;
  size_t remains;
  uchar local_58 [8];
  byte_t temp [64];
  hash256_one_by_one *this_local;
  
  remains._4_4_ = 0;
  std::fill<unsigned_char*,int>(local_58,temp + 0x38,(int *)((long)&remains + 4));
  local_68 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
  local_70._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
  local_78 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                (&this->buffer_);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            (local_70,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )local_78,local_58);
  local_58[local_68] = 0x80;
  if (local_68 < 0x38) {
    local_84[0] = 0;
    std::fill<unsigned_char*,int>(local_58 + local_68 + 1,temp + 0x34,local_84);
  }
  else {
    local_84[2] = 0;
    std::fill<unsigned_char*,int>(local_58 + local_68 + 1,temp + 0x38,local_84 + 2);
    detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,temp + 0x38);
    local_84[1] = 0;
    std::fill<unsigned_char*,int>(local_58,temp + 0x34,local_84 + 1);
  }
  write_data_bit_length(this,temp + 0x30);
  detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,temp + 0x38);
  return;
}

Assistant:

void finish() {
        byte_t temp[64];
        std::fill(temp, temp + 64, 0);
        std::size_t remains = buffer_.size();
        std::copy(buffer_.begin(), buffer_.end(), temp);
        temp[remains] = 0x80;

        if (remains > 55) {
            std::fill(temp + remains + 1, temp + 64, 0);
            detail::hash256_block(h_, temp, temp + 64);
            std::fill(temp, temp + 64 - 4, 0);
        } else {
            std::fill(temp + remains + 1, temp + 64 - 4, 0);
        }

        write_data_bit_length(&(temp[56]));
        detail::hash256_block(h_, temp, temp + 64);
    }